

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

Path * __thiscall
FileSystemUtils::Path::DelimitersToOSDefault(Path *__return_storage_ptr__,Path *this)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  ulong local_28;
  size_t i;
  Path *this_local;
  Path *path;
  
  Path(__return_storage_ptr__,&this->m_string);
  for (local_28 = 0; uVar1 = std::__cxx11::string::size(), local_28 < uVar1; local_28 = local_28 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&__return_storage_ptr__->m_string);
    if (*pcVar2 == '\\') {
      puVar3 = (undefined1 *)
               std::__cxx11::string::operator[]((ulong)&__return_storage_ptr__->m_string);
      *puVar3 = 0x2f;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Path Path::DelimitersToOSDefault()	const
	{
		Path path = m_string;
		for( size_t i = 0; i < path.m_string.size(); ++i )
		{
			if( path.m_string[i] == altseperator )
			{
				path.m_string[i] = seperator;
			}
		}
		return path;
	}